

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void operational_stats_test(bool multi_kv)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined7 in_register_00000039;
  fdb_doc **ppfVar13;
  ulong uVar14;
  uint local_4cc;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  int local_4b0;
  uint local_4ac;
  fdb_kvs_handle *local_4a8 [4];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  ulong local_468;
  long lStack_460;
  long local_458;
  ulong local_450;
  fdb_latency_stat stat;
  fdb_kvs_ops_info rinfo;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_doc *local_3c8 [10];
  char keybuf [256];
  fdb_doc real_doc;
  char bodybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = &real_doc;
  local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = 0;
  lStack_460 = 0;
  local_458 = 0;
  real_doc.keylen = 0;
  real_doc.metalen = 0;
  real_doc.bodylen = 0;
  real_doc.size_ondisk = 0;
  real_doc.offset = 0;
  real_doc.meta = (void *)0x0;
  real_doc.seqnum = 0;
  real_doc.key = keybuf;
  real_doc.deleted = false;
  real_doc._73_3_ = 0;
  real_doc.flags = 0;
  real_doc.body = bodybuf;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.seqtree_opt = '\x01';
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = multi_kv;
  fdb_open(&dbfile,"./dummy1",&fconfig);
  local_4b0 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_4b0 == 0) {
    fVar5 = fdb_kvs_open_default(dbfile,local_4a8,&kvs_config);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x629);
      operational_stats_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x629,"void operational_stats_test(bool)");
    }
    fVar5 = fdb_set_log_callback(local_4a8[0],logCallbackFunc,"operational_stats_test");
    local_4cc = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x62c);
      operational_stats_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x62c,"void operational_stats_test(bool)");
    }
  }
  else {
    local_4cc = 3;
    for (uVar11 = 3; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
      sprintf((char *)&rinfo,"kv%d",(ulong)uVar11);
      fVar5 = fdb_kvs_open(dbfile,local_4a8 + uVar11,(char *)&rinfo,&kvs_config);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x621);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x621,"void operational_stats_test(bool)");
      }
      fVar5 = fdb_set_log_callback(local_4a8[uVar11],logCallbackFunc,"operational_stats_test");
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x624);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x624,"void operational_stats_test(bool)");
      }
    }
  }
  uVar14 = 0;
  while (uVar14 != 10) {
    sprintf(keybuf,"key%d",uVar14 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar14 & 0xffffffff);
    ppfVar13 = local_3c8 + uVar14;
    sVar7 = strlen(keybuf);
    sVar8 = strlen(bodybuf);
    fdb_doc_create(ppfVar13,keybuf,sVar7 + 1,(void *)0x0,0,bodybuf,sVar8 + 1);
    uVar14 = uVar14 + 1;
    uVar11 = local_4cc;
    while (-1 < (int)uVar11) {
      fVar5 = fdb_set(local_4a8[uVar11],*ppfVar13);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x636);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x636,"void operational_stats_test(bool)");
      }
      fVar5 = fdb_get_kvs_ops_info(local_4a8[uVar11],&rinfo);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x638);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x638,"void operational_stats_test(bool)");
      }
      local_488._0_8_ = uVar14;
      iVar6 = bcmp(&rinfo,local_488,0x38);
      uVar11 = uVar11 - 1;
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_488,&rinfo,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x63a);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x63a,"void operational_stats_test(bool)");
      }
    }
  }
  uVar11 = local_4cc;
  do {
    if ((int)uVar11 < 0) {
      local_478._8_8_ = local_478._8_8_ + 1;
      fdb_compact(dbfile,"./dummy2");
      fVar5 = fdb_get_kvs_ops_info(local_4a8[0],&rinfo);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x663);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x663,"void operational_stats_test(bool)");
      }
      iVar6 = bcmp(&rinfo,local_488,0x38);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_488,&rinfo,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x664);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x664,"void operational_stats_test(bool)");
      }
      uVar14 = 0;
      do {
        uVar12 = uVar14;
        if (uVar12 == 10) {
          uVar11 = 0;
          while( true ) {
            if (uVar11 == 0x13) {
              fdb_close(dbfile);
              for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                fdb_doc_free(local_3c8[lVar10]);
              }
              fdb_shutdown();
              memleak_end();
              pcVar9 = "single kv instance";
              if ((char)local_4b0 != '\0') {
                pcVar9 = "multiple kv instances";
              }
              sprintf(bodybuf,"Operational stats test %s",pcVar9);
              pcVar9 = "%s PASSED\n";
              if (operational_stats_test(bool)::__test_pass != '\0') {
                pcVar9 = "%s FAILED\n";
              }
              fprintf(_stderr,pcVar9,bodybuf);
              return;
            }
            stat.lat_count = 0;
            stat.lat_min = 0;
            stat.lat_max = 0;
            stat.lat_avg = 0;
            stat._20_4_ = 0;
            fVar5 = fdb_get_latency_stats(dbfile,&stat,(fdb_latency_stat_type)uVar11);
            if (fVar5 != FDB_RESULT_SUCCESS) break;
            fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",(ulong)uVar11,(ulong)stat.lat_max,
                    stat._16_8_ & 0xffffffff,(ulong)stat.lat_max,stat.lat_count);
            uVar11 = uVar11 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x67f);
          operational_stats_test(bool)::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x67f,"void operational_stats_test(bool)");
        }
        sprintf(keybuf,"key%d",uVar12 & 0xffffffff);
        uVar14 = uVar12 + 1;
        uVar11 = local_4cc;
        while (-1 < (int)uVar11) {
          if ((uVar12 & 1) == 0) {
            if ((uVar12 & 2) == 0) {
              fVar5 = fdb_get_metaonly(local_4a8[uVar11],rdoc);
            }
            else {
              rdoc->seqnum = uVar14;
              fVar5 = fdb_get_byseq(local_4a8[uVar11],rdoc);
            }
          }
          else {
            fVar5 = fdb_get(local_4a8[uVar11],rdoc);
          }
          if (fVar5 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x673);
            operational_stats_test(bool)::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x673,"void operational_stats_test(bool)");
          }
          fVar5 = fdb_get_kvs_ops_info(local_4a8[uVar11],&rinfo);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x675);
            operational_stats_test(bool)::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x675,"void operational_stats_test(bool)");
          }
          local_468 = uVar14;
          iVar6 = bcmp(&rinfo,local_488,0x38);
          uVar11 = uVar11 - 1;
          if (iVar6 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_488,&rinfo,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x677);
            operational_stats_test(bool)::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x677,"void operational_stats_test(bool)");
          }
        }
      } while( true );
    }
    local_450 = (ulong)uVar11;
    local_4ac = uVar11;
    fdb_iterator_init(local_4a8[uVar11],&iterator,(void *)0x0,0,(void *)0x0,0,0);
    ppfVar13 = local_3c8;
    do {
      fVar5 = fdb_iterator_get(iterator,&rdoc);
      pfVar4 = rdoc;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x644);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x644,"void operational_stats_test(bool)");
      }
      pvVar1 = rdoc->key;
      pfVar2 = *ppfVar13;
      pvVar3 = pfVar2->key;
      iVar6 = bcmp(pvVar1,pvVar3,rdoc->keylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x645);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x645,"void operational_stats_test(bool)");
      }
      pvVar1 = pfVar4->body;
      pvVar3 = pfVar2->body;
      iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x646);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x646,"void operational_stats_test(bool)");
      }
      fVar5 = fdb_get_kvs_ops_info(local_4a8[local_450],&rinfo);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x648);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x648,"void operational_stats_test(bool)");
      }
      lStack_460 = lStack_460 + 1;
      local_458 = local_458 + 1;
      iVar6 = bcmp(&rinfo,local_488,0x38);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_488,&rinfo,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x64b);
        operational_stats_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x64b,"void operational_stats_test(bool)");
      }
      fVar5 = fdb_iterator_next(iterator);
      ppfVar13 = ppfVar13 + 1;
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    local_458 = local_458 + 1;
    fdb_iterator_close(iterator);
    fdb_commit(dbfile,'\x01');
    local_478._0_8_ = local_478._0_8_ + 1;
    fVar5 = fdb_get_kvs_ops_info(local_4a8[local_450],&rinfo);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x655);
      operational_stats_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x655,"void operational_stats_test(bool)");
    }
    iVar6 = bcmp(&rinfo,local_488,0x38);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_488,&rinfo,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x656);
      operational_stats_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x656,"void operational_stats_test(bool)");
    }
    uVar11 = local_4ac - 1;
    if (local_4ac != 0) {
      lStack_460 = 0;
      local_458 = 0;
    }
  } while( true );
}

Assistant:

void operational_stats_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_kvs_ops_info info, rinfo;

    char keybuf[256], bodybuf[256];
    memset(&info, 0, sizeof(fdb_kvs_ops_info));
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "operational_stats_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "operational_stats_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_sets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ++info.num_iterator_gets;
            ++info.num_iterator_moves;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
            ++i;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        ++info.num_iterator_moves; // account for the last move that failed
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        ++info.num_commits;

        status = fdb_get_kvs_ops_info(db[r], &rinfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

        if (r) {
            info.num_iterator_gets = 0;
            info.num_iterator_moves = 0;
        }
    }

    ++info.num_compacts;
    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    status = fdb_get_kvs_ops_info(db[0], &rinfo);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            if (i % 2 == 0) {
                if (i % 4 == 0) {
                    status = fdb_get_metaonly(db[r], rdoc);
                } else {
                    rdoc->seqnum = i + 1;
                    status = fdb_get_byseq(db[r], rdoc);
                }
            } else {
                status = fdb_get(db[r], rdoc);
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_gets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }
    // also get latency stats..
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        fdb_latency_stat stat;
        memset(&stat, 0, sizeof(fdb_latency_stat));
        status = fdb_get_latency_stats(dbfile, &stat, i);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fprintf(stderr, "%d:\t%u\t%u\t%u\t%" _F64 "\n", i,
                stat.lat_max, stat.lat_avg, stat.lat_max, stat.lat_count);
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Operational stats test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}